

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSSpStructMatrix.cpp
# Opt level: O1

TPZStructMatrix * __thiscall
TPZSSpStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>::Clone
          (TPZSSpStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
           *this)

{
  long lVar1;
  TPZStructMatrix *this_00;
  
  this_00 = (TPZStructMatrix *)operator_new(0xc0);
  *(undefined ***)this_00 = &PTR__TPZSavable_019eafb8;
  lVar1 = *(long *)(*(long *)&(this->super_TPZStructMatrixT<std::complex<double>_>).
                              super_TPZStructMatrix + -0x60);
  *(undefined8 *)(this_00 + 1) = 0x19eae50;
  *(undefined8 *)this_00 = 0x19eaf18;
  *(undefined4 *)&this_00[1].fMesh =
       *(undefined4 *)
        ((long)&(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh +
        lVar1);
  *(undefined1 *)((long)&this_00[1].fMesh + 4) =
       *(undefined1 *)
        ((long)&(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh +
        lVar1 + 4);
  TPZStructMatrix::TPZStructMatrix
            (this_00,&PTR_construction_vtable_104__019ea778,(TPZStructMatrix *)this);
  *(undefined8 *)this_00 = 0x19ea850;
  *(undefined8 *)(this_00 + 1) = 0x19ea930;
  TPZStructMatrixTBBFlow<std::complex<double>_>::TPZStructMatrixTBBFlow
            ((TPZStructMatrixTBBFlow<std::complex<double>_> *)&this_00->field_0xa0,
             &PTR_construction_vtable_104__019ea7a0,
             (TPZStructMatrixTBBFlow<std::complex<double>_> *)
             &(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.field_0xa0
            );
  *(undefined8 *)this_00 = 0x19ea530;
  *(undefined8 *)(this_00 + 1) = 0x19ea6f8;
  *(undefined8 *)&this_00->field_0xa0 = 0x19ea600;
  return this_00;
}

Assistant:

TPZStructMatrix * TPZSSpStructMatrix<TVar,TPar>::Clone(){
    return new TPZSSpStructMatrix(*this);
}